

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 cnt_class(dtree_node_t *node,uint32 *n_a,uint32 *n_b)

{
  uint32 *n_b_local;
  uint32 *n_a_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    if (node->clust == 0) {
      *n_b = *n_b + 1;
    }
    else {
      *n_a = *n_a + 1;
    }
  }
  else {
    cnt_class(node->y,n_a,n_b);
    cnt_class(node->n,n_a,n_b);
  }
  return 0;
}

Assistant:

uint32
cnt_class(dtree_node_t *node,
	  uint32 *n_a,
	  uint32 *n_b)
{
    if (IS_LEAF(node)) {
	if (node->clust)
	    ++(*n_a);
	else
	    ++(*n_b);
    }
    else {
	cnt_class(node->y, n_a, n_b);
	cnt_class(node->n, n_a, n_b);
    }
    return 0;
}